

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga_x_msb.c
# Opt level: O3

void mgga_x_msb_init(xc_func_type *p)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined8 *puVar7;
  ulong uVar8;
  long lVar9;
  undefined1 extraout_DL;
  undefined7 extraout_var;
  long in_RSI;
  long *plVar10;
  long in_R9;
  long lVar11;
  double *pdVar12;
  ulong uVar13;
  undefined8 uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  long *unaff_retaddr;
  
  plVar10 = (long *)0x18;
  puVar7 = (undefined8 *)malloc(0x18);
  p->params = puVar7;
  uVar2 = p->info->number;
  uVar8 = (ulong)uVar2;
  if (uVar2 == 300) {
    uVar14 = 0x3fe020c49ba5e354;
    uVar19 = 0x3fc2b26bf8769ec3;
    uVar20 = 0x3ff8c00000000000;
  }
  else {
    if (uVar2 != 0x12d) {
      mgga_x_msb_init_cold_1();
      if (in_RSI != 0) {
        pdVar12 = (double *)CONCAT71(extraout_var,extraout_DL);
        lVar5 = plVar10[1];
        lVar6 = plVar10[9];
        dVar24 = 0.0;
        lVar11 = 0;
        do {
          dVar21 = *pdVar12;
          if ((int)lVar5 == 2) {
            dVar21 = dVar21 + pdVar12[1];
          }
          dVar1 = (double)plVar10[0x30];
          if (dVar1 <= dVar21) {
            dVar21 = *pdVar12;
            if (*pdVar12 <= dVar1) {
              dVar21 = dVar1;
            }
            dVar22 = (double)plVar10[0x32] * (double)plVar10[0x32];
            dVar27 = *(double *)(uVar8 + *(int *)((long)plVar10 + 0x4c) * lVar11 * 8);
            if (dVar27 <= dVar22) {
              dVar27 = dVar22;
            }
            uVar2 = *(uint *)(*plVar10 + 0x40);
            if ((uVar2 >> 0x10 & 1) != 0) {
              dVar24 = *(double *)(in_R9 + *(int *)((long)plVar10 + 0x54) * lVar11 * 8);
              if (dVar24 <= (double)plVar10[0x33]) {
                dVar24 = (double)plVar10[0x33];
              }
              if (((uVar2 >> 0x11 & 1) != 0) && (dVar22 = dVar21 * 8.0 * dVar24, dVar22 <= dVar27))
              {
                dVar27 = dVar22;
              }
            }
            dVar22 = 0.0;
            if (dVar1 < dVar21 * 0.5) {
              dVar1 = (double)plVar10[0x31];
              dVar22 = (double)(-(ulong)(dVar1 < 1.0) & 0x3ff0000000000000 |
                               ~-(ulong)(dVar1 < 1.0) & (ulong)(dVar1 + -1.0 + 1.0));
              uVar13 = -(ulong)(dVar22 <= dVar1);
              dVar1 = (double)(uVar13 & (ulong)dVar1 | ~uVar13 & (ulong)dVar22);
              dVar22 = cbrt(dVar1);
              pdVar3 = (double *)plVar10[0x2f];
              dVar15 = cbrt(dVar21);
              dVar23 = 1.0 / (dVar15 * dVar15);
              dVar16 = (dVar23 / dVar21) * dVar24 * 1.5874010519681996;
              dVar17 = cbrt(9.869604401089358);
              dVar18 = dVar17 * dVar17 * 0.9905781746683879 + dVar16;
              dVar25 = dVar18 * dVar18;
              dVar27 = dVar27 * 1.5874010519681996 * (dVar23 / (dVar21 * dVar21));
              dVar16 = dVar27 * -0.125 + dVar16;
              dVar23 = dVar16 * dVar16;
              dVar26 = dVar23 * -4.0 * (1.0 / dVar25) + 1.0;
              dVar21 = *pdVar3;
              dVar27 = (1.0 / (dVar17 * dVar17)) * 1.8171205928321397 * 0.0051440329218107 * dVar27
                       + dVar21;
              dVar17 = (1.0 - dVar21 / dVar27) * dVar21;
              dVar22 = dVar22 * dVar1 * dVar15 * -0.36927938319101117 *
                       (((1.0 - dVar21 / (dVar27 + pdVar3[1])) * dVar21 - dVar17) *
                        (1.0 / (dVar23 * dVar23 * pdVar3[2] * dVar23 * 64.0 *
                                ((1.0 / (dVar25 * dVar25)) / dVar25) +
                                dVar16 * dVar23 * 8.0 * (1.0 / (dVar18 * dVar25)) + 1.0)) *
                        dVar26 * dVar26 * dVar26 + dVar17 + 1.0);
              dVar22 = dVar22 + dVar22;
            }
            lVar4 = *unaff_retaddr;
            if ((uVar2 & 1) != 0 && lVar4 != 0) {
              lVar9 = (int)plVar10[0xb] * lVar11;
              *(double *)(lVar4 + lVar9 * 8) = dVar22 + *(double *)(lVar4 + lVar9 * 8);
            }
          }
          lVar11 = lVar11 + 1;
          pdVar12 = pdVar12 + (int)lVar6;
        } while (in_RSI != lVar11);
      }
      return;
    }
    uVar14 = 0x3fe40aa64c2f837b;
    uVar19 = 0x3fbf67f4dbdf8f47;
    uVar20 = 0x401134538ef34d6a;
  }
  puVar7[2] = uVar20;
  *puVar7 = uVar14;
  puVar7[1] = uVar19;
  return;
}

Assistant:

static void
mgga_x_msb_init(xc_func_type *p)
{
  mgga_x_msb_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(mgga_x_msb_params));
  params = (mgga_x_msb_params *)p->params;

  switch(p->info->number){
  case XC_MGGA_X_MS2B:
    params->kappa = 0.504;
    params->b     = (27.0*4.0 - 9.0)/64.0;
    params->c     = 0.14607;
    break;
  case XC_MGGA_X_MS2BS:
    params->kappa = 0.6263;
    params->b     = 4.3011;
    params->c     = 0.12268;
    break;
  default:
    fprintf(stderr, "Internal error in mgga_x_msb\n");
    exit(1);
  }
}